

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CZ<float>::CZ(CZ<float> *this,int control,int target,int controlState)

{
  PauliZ<float> *pPVar1;
  
  QControlledGate2<float>::QControlledGate2
            (&this->super_QControlledGate2<float>,control,controlState);
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001359b0;
  pPVar1 = (PauliZ<float> *)operator_new(0x10);
  (pPVar1->super_QGate1<float>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,"qclab::qgates::QGate1<float>::QGate1(const int) [T = float]");
  }
  (pPVar1->super_QGate1<float>).super_QObject<float> = (QObject<float>)&PTR_nbQubits_00134c60;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<float>,_std::default_delete<qclab::qgates::PauliZ<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<float>_*,_std::default_delete<qclab::qgates::PauliZ<float>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<float>_*,_false>._M_head_impl = pPVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                  ,0x2c,"qclab::qgates::CZ<float>::CZ(const int, const int, const int) [T = float]")
    ;
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                ,0x2b,"qclab::qgates::CZ<float>::CZ(const int, const int, const int) [T = float]");
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }